

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O0

void quantize_fp_64x64(__m256i *thr,__m256i *qp,tran_low_t *coeff_ptr,int16_t *iscan_ptr,
                      tran_low_t *qcoeff_ptr,tran_low_t *dqcoeff_ptr,__m256i *eob)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i coeff_vals;
  __m256i coeff_vals_00;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 (*in_stack_00000008) [32];
  __m256i z_mask;
  __m256i dq;
  __m256i q;
  __m256i abs_dq;
  __m256i dql;
  __m256i dqh;
  __m256i abs_q;
  __m256i ql;
  __m256i qh;
  __m256i tmp_rnd;
  int nzflag;
  __m256i mask;
  __m256i abs_coeff;
  __m256i coeff;
  __m256i v_nz_iscan;
  __m256i v_iscan_plus1;
  __m256i v_iscan_perm;
  __m256i v_iscan;
  tran_low_t *local_8a0;
  tran_low_t *in_stack_fffffffffffff780;
  tran_low_t *coeff_ptr_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  longlong lVar7;
  ulong uStack_678;
  
  load_coefficients_avx2(in_stack_fffffffffffff780);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vpabsw_avx2(auVar1);
  auVar2 = vpcmpgtw_avx2(auVar1,*in_RDI);
  if ((((((((((((((((((((((((((((((((auVar2 >> 7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                   && (auVar2 >> 0xf & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                  (auVar2 >> 0x17 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                                 && (auVar2 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                (auVar2 >> 0x27 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar2 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar2 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar2 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar2 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar2 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar2 >> 0x57 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar2 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar2 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar2 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar2 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar2 >> 0x7f,0) == '\0') &&
                    (auVar2 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar2 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar2 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar2 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar2 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar2 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar2 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar2 >> 0xbf,0) == '\0') &&
            (auVar2 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar2 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar2 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         (auVar2 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
        (auVar2 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
       (auVar2 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
      (auVar2 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar2[0x1f]) {
    write_zero(local_8a0);
    write_zero(local_8a0);
  }
  else {
    auVar1 = vpaddsw_avx2(auVar1,*in_RSI);
    auVar1 = vpand_avx2(auVar1,auVar2);
    auVar2 = vpmulhw_avx2(auVar1,in_RSI[1]);
    auVar2 = vpsllw_avx2(auVar2,ZEXT416(2));
    auVar1 = vpmullw_avx2(auVar1,in_RSI[1]);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(0xe));
    auVar2 = vpor_avx2(auVar2,auVar1);
    auVar1 = vpmulhw_avx2(auVar2,in_RSI[2]);
    auVar3 = vpsllw_avx2(auVar1,ZEXT416(0xe));
    auVar1 = vpmullw_avx2(auVar2,in_RSI[2]);
    auVar1 = vpsrlw_avx2(auVar1,ZEXT416(2));
    auVar1 = vpor_avx2(auVar3,auVar1);
    uVar5 = auVar1._0_8_;
    uVar6 = auVar1._8_8_;
    lVar7 = auVar1._16_8_;
    auVar3._8_8_ = in_XMM0_Qb;
    auVar3._0_8_ = in_XMM0_Qa;
    auVar3._16_8_ = in_YMM0_H;
    auVar3._24_8_ = in_register_00001218;
    auVar2 = vpsignw_avx2(auVar2,auVar3);
    coeff_ptr_00 = auVar2._16_8_;
    uVar4 = auVar2._24_8_;
    auVar2._8_8_ = in_XMM0_Qb;
    auVar2._0_8_ = in_XMM0_Qa;
    auVar2._16_8_ = in_YMM0_H;
    auVar2._24_8_ = in_register_00001218;
    auVar1 = vpsignw_avx2(auVar1,auVar2);
    uStack_678 = SUB328(ZEXT832(0),4);
    auVar1 = vpcmpeqw_avx2(auVar1,ZEXT832(uStack_678) << 0x40);
    auVar1 = vpcmpeqw_avx2(auVar1,ZEXT832(uStack_678) << 0x40);
    coeff_vals[1] = uVar5;
    coeff_vals[0] = uVar4;
    coeff_vals[2] = uVar6;
    coeff_vals[3] = lVar7;
    store_coefficients_avx2(coeff_vals,coeff_ptr_00);
    coeff_vals_00[1] = uVar5;
    coeff_vals_00[0] = uVar4;
    coeff_vals_00[2] = uVar6;
    coeff_vals_00[3] = lVar7;
    store_coefficients_avx2(coeff_vals_00,coeff_ptr_00);
    auVar2 = vpermq_avx2(*in_RCX,0xd8);
    auVar2 = vpsubw_avx2(auVar2,auVar1);
    auVar1 = vpand_avx2(auVar2,auVar1);
    auVar1 = vpmaxsw_avx2(*in_stack_00000008,auVar1);
    *in_stack_00000008 = auVar1;
  }
  return;
}

Assistant:

static inline void quantize_fp_64x64(const __m256i *thr, const __m256i *qp,
                                     const tran_low_t *coeff_ptr,
                                     const int16_t *iscan_ptr,
                                     tran_low_t *qcoeff_ptr,
                                     tran_low_t *dqcoeff_ptr, __m256i *eob) {
  const __m256i coeff = load_coefficients_avx2(coeff_ptr);
  const __m256i abs_coeff = _mm256_abs_epi16(coeff);
  const __m256i mask = _mm256_cmpgt_epi16(abs_coeff, *thr);
  const int nzflag = _mm256_movemask_epi8(mask);

  if (nzflag) {
    const __m256i tmp_rnd =
        _mm256_and_si256(_mm256_adds_epi16(abs_coeff, qp[0]), mask);
    const __m256i qh = _mm256_slli_epi16(_mm256_mulhi_epi16(tmp_rnd, qp[1]), 2);
    const __m256i ql =
        _mm256_srli_epi16(_mm256_mullo_epi16(tmp_rnd, qp[1]), 14);
    const __m256i abs_q = _mm256_or_si256(qh, ql);
    const __m256i dqh = _mm256_slli_epi16(_mm256_mulhi_epi16(abs_q, qp[2]), 14);
    const __m256i dql = _mm256_srli_epi16(_mm256_mullo_epi16(abs_q, qp[2]), 2);
    const __m256i abs_dq = _mm256_or_si256(dqh, dql);
    const __m256i q = _mm256_sign_epi16(abs_q, coeff);
    const __m256i dq = _mm256_sign_epi16(abs_dq, coeff);
    // Check the signed q/dq value here instead of the absolute value. When
    // dequant equals 4, the dequant threshold (*thr) becomes 0 after being
    // scaled down by (1 + log_scale). See init_qp(). When *thr is 0 and the
    // abs_coeff is 0, the nzflag will be set. As a result, the eob will be
    // incorrectly calculated. The psign instruction corrects the error by
    // zeroing out q/dq if coeff is zero.
    const __m256i z_mask = _mm256_cmpeq_epi16(dq, _mm256_setzero_si256());
    const __m256i nz_mask = _mm256_cmpeq_epi16(z_mask, _mm256_setzero_si256());

    store_coefficients_avx2(q, qcoeff_ptr);
    store_coefficients_avx2(dq, dqcoeff_ptr);

    *eob = get_max_lane_eob(iscan_ptr, *eob, nz_mask);
  } else {
    write_zero(qcoeff_ptr);
    write_zero(dqcoeff_ptr);
  }
}